

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O0

void __thiscall
fizplex::BaseTestRegularNoReordering_Invert_Test::~BaseTestRegularNoReordering_Invert_Test
          (BaseTestRegularNoReordering_Invert_Test *this)

{
  void *in_RDI;
  
  ~BaseTestRegularNoReordering_Invert_Test((BaseTestRegularNoReordering_Invert_Test *)0x1c4358);
  operator_delete(in_RDI,0x108);
  return;
}

Assistant:

TEST_F(BaseTestRegularNoReordering, Invert) {
  b.ftran(sv0);
  b.ftran(sv1);
  b.ftran(sv2);
  EXPECT_EQ(SVector({{0, -2}, {1, 3}, {2, 9}}), sv0);
  EXPECT_EQ(SVector({{0, 8}, {1, -11}, {2, -34}}), sv1);
  EXPECT_EQ(SVector({{0, -5}, {1, 7}, {2, 21}}), sv2);
}